

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.cpp
# Opt level: O0

void __thiscall
CoreML::Recommender::_ItemSimilarityRecommenderData::_ItemSimilarityRecommenderData
          (_ItemSimilarityRecommenderData *this,ItemSimilarityRecommender *isr)

{
  size_type sVar1;
  size_type sVar2;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *this_00;
  bool bVar3;
  int iVar4;
  unsigned_long *puVar5;
  mapped_type_conflict *pmVar6;
  Int64Vector *pIVar7;
  const_iterator __first;
  const_iterator __last;
  size_type sVar8;
  StringVector *pSVar9;
  invalid_argument *piVar10;
  iterator __first_00;
  iterator __last_00;
  size_type sVar11;
  string *psVar12;
  double dVar13;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2a0;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_288;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *itemstringidsVector;
  string local_278;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  long *local_1b8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_1b0;
  set<long,_std::less<long>,_std::allocator<long>_> local_1a8;
  vector<long,_std::allocator<long>_> *local_178;
  vector<long,_std::allocator<long>_> *local_170;
  RepeatedField<long> *local_168;
  RepeatedField<long> *itemint64idsVector;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  double local_98;
  double score_shift;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  local_88;
  pair<unsigned_long,_double> local_80;
  double local_70;
  double score;
  uint64_t inter_id;
  ItemSimilarityRecommender_ConnectedItem *interaction;
  int j;
  int n_interactions;
  mapped_type *interaction_list_dest;
  uint64_t item_id;
  ItemSimilarityRecommender_SimilarItems *item_sim_info;
  int i;
  int local_24;
  unsigned_long uStack_20;
  int n_similarities;
  uint64_t max_item;
  ItemSimilarityRecommender *isr_local;
  _ItemSimilarityRecommenderData *this_local;
  
  max_item = (uint64_t)isr;
  isr_local = (ItemSimilarityRecommender *)this;
  std::
  map<unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
  ::map(&this->item_interactions);
  std::
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::map(&this->item_shift_values);
  std::__cxx11::string::string((string *)&this->item_restriction_input_column);
  std::__cxx11::string::string((string *)&this->num_recommendations_input_column);
  std::__cxx11::string::string((string *)&this->item_exclusion_input_column);
  std::__cxx11::string::string((string *)&this->item_data_input_column);
  std::__cxx11::string::string((string *)&this->item_list_output_column);
  std::__cxx11::string::string((string *)&this->item_score_output_column);
  std::vector<long,_std::allocator<long>_>::vector(&this->integer_id_values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->string_id_values);
  uStack_20 = 0;
  local_24 = Specification::ItemSimilarityRecommender::itemitemsimilarities_size
                       ((ItemSimilarityRecommender *)max_item);
  for (item_sim_info._0_4_ = 0; (int)item_sim_info < local_24;
      item_sim_info._0_4_ = (int)item_sim_info + 1) {
    item_id = (uint64_t)
              Specification::ItemSimilarityRecommender::itemitemsimilarities
                        ((ItemSimilarityRecommender *)max_item,(int)item_sim_info);
    interaction_list_dest =
         (mapped_type *)
         Specification::ItemSimilarityRecommender_SimilarItems::itemid
                   ((ItemSimilarityRecommender_SimilarItems *)item_id);
    puVar5 = std::max<unsigned_long>
                       (&stack0xffffffffffffffe0,(unsigned_long *)&interaction_list_dest);
    uStack_20 = *puVar5;
    _j = std::
         map<unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
         ::operator[](&this->item_interactions,(key_type_conflict *)&interaction_list_dest);
    interaction._4_4_ =
         Specification::ItemSimilarityRecommender_SimilarItems::similaritemlist_size
                   ((ItemSimilarityRecommender_SimilarItems *)item_id);
    for (interaction._0_4_ = 0; (int)interaction < interaction._4_4_;
        interaction._0_4_ = (int)interaction + 1) {
      inter_id = (uint64_t)
                 Specification::ItemSimilarityRecommender_SimilarItems::similaritemlist
                           ((ItemSimilarityRecommender_SimilarItems *)item_id,(int)interaction);
      score = (double)Specification::ItemSimilarityRecommender_ConnectedItem::itemid
                                ((ItemSimilarityRecommender_ConnectedItem *)inter_id);
      local_70 = Specification::ItemSimilarityRecommender_ConnectedItem::similarityscore
                           ((ItemSimilarityRecommender_ConnectedItem *)inter_id);
      this_00 = _j;
      std::pair<unsigned_long,_double>::pair<unsigned_long_&,_double_&,_true>
                (&local_80,(unsigned_long *)&score,&local_70);
      std::
      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
      push_back(this_00,&local_80);
      puVar5 = std::max<unsigned_long>(&stack0xffffffffffffffe0,(unsigned_long *)&score);
      uStack_20 = *puVar5;
    }
    local_88._M_current =
         (pair<unsigned_long,_double> *)
         std::
         vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
         ::begin(_j);
    score_shift = (double)std::
                          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ::end(_j);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>
              (local_88,(__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                         )score_shift);
    dVar13 = Specification::ItemSimilarityRecommender_SimilarItems::itemscoreadjustment
                       ((ItemSimilarityRecommender_SimilarItems *)item_id);
    local_98 = dVar13;
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      pmVar6 = std::
               map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
               ::operator[](&this->item_shift_values,(key_type_conflict *)&interaction_list_dest);
      *pmVar6 = dVar13;
    }
  }
  this->num_items = 0;
  bVar3 = Specification::ItemSimilarityRecommender::has_itemint64ids
                    ((ItemSimilarityRecommender *)max_item);
  if (bVar3) {
    pIVar7 = Specification::ItemSimilarityRecommender::itemint64ids
                       ((ItemSimilarityRecommender *)max_item);
    iVar4 = Specification::Int64Vector::vector_size(pIVar7);
    if (iVar4 != 0) {
      bVar3 = Specification::ItemSimilarityRecommender::has_itemstringids
                        ((ItemSimilarityRecommender *)max_item);
      if (bVar3) {
        pSVar9 = Specification::ItemSimilarityRecommender::itemstringids
                           ((ItemSimilarityRecommender *)max_item);
        iVar4 = Specification::StringVector::vector_size(pSVar9);
        if (iVar4 != 0) {
          piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar10,
                     "Only integer item ids or string item ids can be specified in the same model.")
          ;
          __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      pIVar7 = Specification::ItemSimilarityRecommender::itemint64ids
                         ((ItemSimilarityRecommender *)max_item);
      iVar4 = Specification::Int64Vector::vector_size(pIVar7);
      this->num_items = (long)iVar4;
      if (this->num_items <= uStack_20) {
        itemint64idsVector._7_1_ = 1;
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_138,uStack_20);
        std::operator+(&local_118,
                       "List of integer item ids specified must be large enough to index all item ids specified.  The largest item index is "
                       ,&local_138);
        std::operator+(&local_f8,&local_118,", whereas there are  only ");
        std::__cxx11::to_string(&local_158,this->num_items);
        std::operator+(&local_d8,&local_f8,&local_158);
        std::operator+(&local_b8,&local_d8," item ids given.");
        std::invalid_argument::invalid_argument(piVar10,(string *)&local_b8);
        itemint64idsVector._7_1_ = 0;
        __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pIVar7 = Specification::ItemSimilarityRecommender::itemint64ids
                         ((ItemSimilarityRecommender *)max_item);
      local_168 = Specification::Int64Vector::vector(pIVar7);
      std::vector<long,_std::allocator<long>_>::reserve(&this->integer_id_values,this->num_items);
      __first = google::protobuf::RepeatedField<long>::begin(local_168);
      __last = google::protobuf::RepeatedField<long>::end(local_168);
      local_170 = (vector<long,_std::allocator<long>_> *)
                  std::back_inserter<std::vector<long,std::allocator<long>>>
                            (&this->integer_id_values);
      local_178 = (vector<long,_std::allocator<long>_> *)
                  std::
                  copy<long_const*,std::back_insert_iterator<std::vector<long,std::allocator<long>>>>
                            (__first,__last,
                             (back_insert_iterator<std::vector<long,_std::allocator<long>_>_>)
                             local_170);
      local_1b0._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::begin(&this->integer_id_values);
      local_1b8 = (long *)std::vector<long,_std::allocator<long>_>::end(&this->integer_id_values);
      std::set<long,std::less<long>,std::allocator<long>>::
      set<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
                ((set<long,std::less<long>,std::allocator<long>> *)&local_1a8,local_1b0,
                 (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)local_1b8);
      sVar8 = std::set<long,_std::less<long>,_std::allocator<long>_>::size(&local_1a8);
      sVar1 = this->num_items;
      std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_1a8);
      if (sVar8 != sVar1) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar10,
                   "List of integer item ids specified must be unique; list contains duplicates.");
        __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      goto LAB_00a01178;
    }
  }
  bVar3 = Specification::ItemSimilarityRecommender::has_itemstringids
                    ((ItemSimilarityRecommender *)max_item);
  if (bVar3) {
    pSVar9 = Specification::ItemSimilarityRecommender::itemstringids
                       ((ItemSimilarityRecommender *)max_item);
    iVar4 = Specification::StringVector::vector_size(pSVar9);
    if (iVar4 != 0) {
      pSVar9 = Specification::ItemSimilarityRecommender::itemstringids
                         ((ItemSimilarityRecommender *)max_item);
      iVar4 = Specification::StringVector::vector_size(pSVar9);
      this->num_items = (long)iVar4;
      pSVar9 = Specification::ItemSimilarityRecommender::itemstringids
                         ((ItemSimilarityRecommender *)max_item);
      iVar4 = Specification::StringVector::vector_size(pSVar9);
      if ((ulong)(long)iVar4 < uStack_20) {
        itemstringidsVector._7_1_ = 1;
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_258,uStack_20);
        std::operator+(&local_238,
                       "List of string item ids specified must be large enough to index all item ids specified.  The largest item index is "
                       ,&local_258);
        std::operator+(&local_218,&local_238,", whereas there are  only ");
        std::__cxx11::to_string(&local_278,this->num_items);
        std::operator+(&local_1f8,&local_218,&local_278);
        std::operator+(&local_1d8,&local_1f8," item ids given.");
        std::invalid_argument::invalid_argument(piVar10,(string *)&local_1d8);
        itemstringidsVector._7_1_ = 0;
        __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pSVar9 = Specification::ItemSimilarityRecommender::itemstringids
                         ((ItemSimilarityRecommender *)max_item);
      local_288 = Specification::StringVector::vector_abi_cxx11_(pSVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&this->string_id_values,this->num_items);
      local_290.it_ =
           (void **)google::protobuf::
                    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::begin(local_288);
      local_298.it_ =
           (void **)google::protobuf::
                    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::end(local_288);
      local_2a0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                               (&this->string_id_values);
      local_2a8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     copy<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                               (local_290,local_298,
                                (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )local_2a0);
      __first_00 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->string_id_values);
      __last_00 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&this->string_id_values);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_2d8,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first_00._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last_00._M_current);
      sVar11 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&local_2d8);
      sVar2 = this->num_items;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set(&local_2d8);
      if (sVar11 != sVar2) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar10,
                   "List of string item ids specified must be unique; list contains duplicates.");
        __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      goto LAB_00a01178;
    }
  }
  this->num_items = uStack_20 + 1;
LAB_00a01178:
  psVar12 = Specification::ItemSimilarityRecommender::iteminputfeaturename_abi_cxx11_
                      ((ItemSimilarityRecommender *)max_item);
  std::__cxx11::string::operator=((string *)&this->item_data_input_column,(string *)psVar12);
  psVar12 = Specification::ItemSimilarityRecommender::numrecommendationsinputfeaturename_abi_cxx11_
                      ((ItemSimilarityRecommender *)max_item);
  std::__cxx11::string::operator=
            ((string *)&this->num_recommendations_input_column,(string *)psVar12);
  psVar12 = Specification::ItemSimilarityRecommender::itemexclusioninputfeaturename_abi_cxx11_
                      ((ItemSimilarityRecommender *)max_item);
  std::__cxx11::string::operator=((string *)&this->item_exclusion_input_column,(string *)psVar12);
  psVar12 = Specification::ItemSimilarityRecommender::itemrestrictioninputfeaturename_abi_cxx11_
                      ((ItemSimilarityRecommender *)max_item);
  std::__cxx11::string::operator=((string *)&this->item_restriction_input_column,(string *)psVar12);
  psVar12 = Specification::ItemSimilarityRecommender::
            recommendeditemlistoutputfeaturename_abi_cxx11_((ItemSimilarityRecommender *)max_item);
  std::__cxx11::string::operator=((string *)&this->item_list_output_column,(string *)psVar12);
  psVar12 = Specification::ItemSimilarityRecommender::
            recommendeditemscoreoutputfeaturename_abi_cxx11_((ItemSimilarityRecommender *)max_item);
  std::__cxx11::string::operator=((string *)&this->item_score_output_column,(string *)psVar12);
  return;
}

Assistant:

_ItemSimilarityRecommenderData::_ItemSimilarityRecommenderData(const Specification::ItemSimilarityRecommender& isr) {

    uint64_t max_item = 0;
    int n_similarities = isr.itemitemsimilarities_size();

    for(int i = 0; i < n_similarities; ++i) {
      const auto& item_sim_info = isr.itemitemsimilarities(i);
      uint64_t item_id = item_sim_info.itemid();
      max_item = std::max(max_item, item_id);

      auto& interaction_list_dest = item_interactions[item_id];
      int n_interactions = item_sim_info.similaritemlist_size();

      for(int j = 0; j < n_interactions; ++j) {
        const auto& interaction = item_sim_info.similaritemlist(j);
        uint64_t inter_id = interaction.itemid();
        double score = interaction.similarityscore();

        interaction_list_dest.push_back({inter_id, score});

        max_item = std::max(max_item, inter_id);
      }

      // Sort to ensure equality between equivalent models.
      std::sort(interaction_list_dest.begin(), interaction_list_dest.end());
      double score_shift = item_sim_info.itemscoreadjustment();
      if(score_shift != 0) {
        item_shift_values[item_id] = score_shift;
      }
    }

    num_items = 0;

    // Check out the item similarity
    if(isr.has_itemint64ids() && isr.itemint64ids().vector_size() != 0) {
      if(isr.has_itemstringids() && isr.itemstringids().vector_size() != 0) {
        throw std::invalid_argument("Only integer item ids or string item ids can be specified in the same model.");
      }
      
      num_items = uint64_t(isr.itemint64ids().vector_size());

      if(num_items <= max_item) {
        throw std::invalid_argument("List of integer item ids specified must be "
                                    "large enough to index all item ids specified.  The largest item "
                                    "index is " + std::to_string(max_item) + ", whereas there are "
                                    " only " + std::to_string(num_items) + " item ids given.");
      }


      const auto& itemint64idsVector = isr.itemint64ids().vector();
      integer_id_values.reserve(static_cast<size_t>(num_items));
      std::copy(itemint64idsVector.begin(), itemint64idsVector.end(), std::back_inserter(integer_id_values));

      if(std::set<int64_t>(integer_id_values.begin(), integer_id_values.end()).size() != num_items) {
        throw std::invalid_argument("List of integer item ids specified must be "
                                    "unique; list contains duplicates.");
      }

    } else if(isr.has_itemstringids() && isr.itemstringids().vector_size() != 0) {
      
      num_items = size_t(isr.itemstringids().vector_size());

      if(size_t(isr.itemstringids().vector_size()) < max_item) {
        throw std::invalid_argument("List of string item ids specified must be "
                                    "large enough to index all item ids specified.  The largest item "
                                    "index is " + std::to_string(max_item) + ", whereas there are "
                                    " only " + std::to_string(num_items) + " item ids given.");
      }

      const auto& itemstringidsVector = isr.itemstringids().vector();
      string_id_values.reserve(static_cast<size_t>(num_items));
      std::copy(itemstringidsVector.begin(), itemstringidsVector.end(), std::back_inserter(string_id_values));

      if(std::set<std::string>(string_id_values.begin(), string_id_values.end()).size() != num_items) {
        throw std::invalid_argument("List of string item ids specified must be "
                                    "unique; list contains duplicates.");
      }
    } else {
      num_items = max_item + 1;
    }

    // Check out the specific parameters
    item_data_input_column = isr.iteminputfeaturename();
    num_recommendations_input_column = isr.numrecommendationsinputfeaturename();
    item_exclusion_input_column = isr.itemexclusioninputfeaturename();
    item_restriction_input_column = isr.itemrestrictioninputfeaturename();

    // Get the item output columns.
    item_list_output_column = isr.recommendeditemlistoutputfeaturename();
    item_score_output_column = isr.recommendeditemscoreoutputfeaturename();
  }